

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

int __thiscall raspicam::_private::Private_Impl_Still::initialize(Private_Impl_Still *this)

{
  MMAL_PORT_T *output_port;
  MMAL_PORT_T *input_port;
  int iVar1;
  MMAL_STATUS_T MVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  Private_Impl_Still *this_00;
  
  iVar1 = 0;
  if (this->_isInitialized == false) {
    iVar1 = createCamera(this);
    if (iVar1 == 0) {
      this_00 = this;
      iVar1 = createEncoder(this);
      if (iVar1 == 0) {
        output_port = this->camera->output[2];
        this->camera_still_port = output_port;
        input_port = *this->encoder->input;
        this->encoder_input_port = input_port;
        this->encoder_output_port = *this->encoder->output;
        MVar2 = connectPorts(this_00,output_port,input_port,&this->encoder_connection);
        if (MVar2 != MMAL_SUCCESS) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERROR: Could not connect encoder ports!\n",0x28);
          return -1;
        }
        this->_isInitialized = true;
        return 0;
      }
      pcVar5 = this->API_NAME;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
      }
      pcVar5 = ": Failed to create encoder component.\n";
      lVar4 = 0x26;
    }
    else {
      pcVar5 = this->API_NAME;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
      }
      pcVar5 = ": Failed to create camera component.\n";
      lVar4 = 0x25;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
    iVar1 = -1;
    if (this->camera != (MMAL_COMPONENT_T *)0x0) {
      mmal_component_destroy(this->camera);
      this->camera = (MMAL_COMPONENT_T *)0x0;
    }
  }
  return iVar1;
}

Assistant:

int Private_Impl_Still::initialize() {
            if ( _isInitialized ) return 0;
            if ( createCamera() ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            } else if ( createEncoder() ) {
                cout << API_NAME << ": Failed to create encoder component.\n";
                destroyCamera();
                return -1;
            } else {
                camera_still_port	= camera->output[MMAL_CAMERA_CAPTURE_PORT];
                encoder_input_port  = encoder->input[0];
                encoder_output_port = encoder->output[0];
                if ( connectPorts ( camera_still_port, encoder_input_port, &encoder_connection ) != MMAL_SUCCESS ) {
                    cout << "ERROR: Could not connect encoder ports!\n";
                    return -1;
                }
            }
            _isInitialized=true;
            return 0;
        }